

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void pick_up_item(tgestate_t *state)

{
  tgestate_t *state_00;
  tgestate_t *in_RDI;
  tgestate_t *unaff_retaddr;
  attribute_t attrs;
  item_t item;
  item_t *pitem;
  itemstruct_t *itemstr;
  sound_t in_stack_ffffffffffffffdc;
  undefined6 in_stack_ffffffffffffffe0;
  attribute_t in_stack_ffffffffffffffe6;
  item_t iVar1;
  item_t *piVar2;
  attribute_t attrs_00;
  
  if (((in_RDI->items_held[0] == 0xff) || (in_RDI->items_held[1] == 0xff)) &&
     (state_00 = (tgestate_t *)find_nearby_item(in_RDI), state_00 != (tgestate_t *)0x0)) {
    piVar2 = in_RDI->items_held;
    iVar1 = *piVar2;
    if (iVar1 != 0xff) {
      piVar2 = in_RDI->items_held + 1;
    }
    *piVar2 = (byte)state_00->width & 0x1f;
    if (in_RDI->room_index == '\0') {
      plot_all_tiles(state_00);
    }
    else {
      setup_room(unaff_retaddr);
      attrs_00 = (attribute_t)((ulong)piVar2 >> 0x38);
      plot_interior_tiles(in_RDI);
      in_stack_ffffffffffffffe6 =
           choose_game_window_attributes
                     ((tgestate_t *)
                      CONCAT17(iVar1,CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)))
      ;
      set_game_window_attributes(state_00,attrs_00);
    }
    if ((state_00->width & 0x80) == 0) {
      *(byte *)&state_00->width = (byte)state_00->width | 0x80;
      increase_morale_by_5_score_by_5((tgestate_t *)0x107ea3);
    }
    *(undefined1 *)((long)&state_00->width + 1) = 0;
    *(undefined1 *)((long)&state_00->height + 1) = 0;
    *(undefined1 *)((long)&state_00->height + 2) = 0;
    draw_all_items((tgestate_t *)0x107ec8);
    play_speaker((tgestate_t *)
                 CONCAT17(iVar1,CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
                 in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void pick_up_item(tgestate_t *state)
{
  itemstruct_t *itemstr; /* was HL */
  item_t       *pitem;   /* was DE */
  item_t        item;    /* was A */
  attribute_t   attrs;   /* was A */

  assert(state != NULL);

  if (state->items_held[0] != item_NONE &&
      state->items_held[1] != item_NONE)
    return; /* No spare slots. */

  itemstr = find_nearby_item(state);
  if (itemstr == NULL)
    return; /* No item nearby. */

  /* Locate an empty item slot. */
  pitem = &state->items_held[0];
  item = *pitem;
  if (item != item_NONE)
    pitem++;
  *pitem = itemstr->item_and_flags & (itemstruct_ITEM_MASK | itemstruct_ITEM_FLAG_UNKNOWN); // I don't see this unknown flag used anywhere else in the code. Is it a real flag, or evidence that the items pool was originally larger (ie. up to 32 objects rather than 16).

  if (state->room_index == room_0_OUTDOORS)
  {
    /* Outdoors. */
    plot_all_tiles(state);
  }
  else
  {
    /* Indoors. */
    // FUTURE: replace with call to setup_room_and_plot
    setup_room(state);
    plot_interior_tiles(state);
    attrs = choose_game_window_attributes(state);
    set_game_window_attributes(state, attrs);
  }

  if ((itemstr->item_and_flags & itemstruct_ITEM_FLAG_HELD) == 0)
  {
    /* Have picked up an item not previously held. */
    itemstr->item_and_flags |= itemstruct_ITEM_FLAG_HELD;
    increase_morale_by_5_score_by_5(state);
  }

  itemstr->room_and_flags = 0;
  itemstr->isopos.x       = 0;
  itemstr->isopos.y       = 0;

  draw_all_items(state);
  play_speaker(state, sound_PICK_UP_ITEM);
}